

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall
NNTreeImpl::withinLimits(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *node)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QPDFObjectHandle QVar5;
  byte local_12a;
  allocator<char> local_101;
  string local_100;
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  byte local_99;
  QPDFObjectHandle local_98;
  byte local_81;
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle limits;
  int result;
  QPDFObjectHandle *node_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Limits",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_38,(string *)node);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_81 = 0;
  local_99 = 0;
  bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_38);
  local_12a = 0;
  if (bVar2) {
    iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_38);
    local_12a = 0;
    if (1 < iVar4) {
      pNVar1 = this->details;
      QVar5 = QPDFObjectHandle::getArrayItem(local_80,(int)local_38);
      local_81 = 1;
      bVar3 = (**(code **)(*(long *)pNVar1 + 8))
                        (pNVar1,local_80,
                         QVar5.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      local_12a = 0;
      if ((bVar3 & 1) != 0) {
        pNVar1 = this->details;
        QVar5 = QPDFObjectHandle::getArrayItem(&local_98,(int)local_38);
        local_99 = 1;
        local_12a = (**(code **)(*(long *)pNVar1 + 8))
                              (pNVar1,&local_98,
                               QVar5.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      }
    }
  }
  if ((local_99 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  }
  if ((local_81 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_80);
  }
  if ((local_12a & 1) == 0) {
    QTC::TC("qpdf","NNTree missing limits",0);
    qpdf = this->qpdf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"node is missing /Limits",&local_101);
    ::error(qpdf,node,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  else {
    pNVar1 = this->details;
    QPDFObjectHandle::QPDFObjectHandle(&local_b0,key);
    QPDFObjectHandle::getArrayItem(&local_c0,(int)local_38);
    iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_b0,&local_c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
    if (iVar4 < 0) {
      limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = -1;
    }
    else {
      pNVar1 = this->details;
      QPDFObjectHandle::QPDFObjectHandle(&local_d0,key);
      QPDFObjectHandle::getArrayItem(&local_e0,(int)local_38);
      iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_d0,&local_e0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
      if (0 < iVar4) {
        limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 1;
      }
    }
  }
  iVar4 = limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  return iVar4;
}

Assistant:

int
NNTreeImpl::withinLimits(QPDFObjectHandle key, QPDFObjectHandle node)
{
    int result = 0;
    auto limits = node.getKey("/Limits");
    if (limits.isArray() && (limits.getArrayNItems() >= 2) &&
        details.keyValid(limits.getArrayItem(0)) && details.keyValid(limits.getArrayItem(1))) {
        if (details.compareKeys(key, limits.getArrayItem(0)) < 0) {
            result = -1;
        } else if (details.compareKeys(key, limits.getArrayItem(1)) > 0) {
            result = 1;
        }
    } else {
        QTC::TC("qpdf", "NNTree missing limits");
        error(qpdf, node, "node is missing /Limits");
    }
    return result;
}